

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNABase::FMMix(OPNABase *this,Sample *buffer,int nsamples)

{
  Channel4 *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if (0 < (this->super_OPNBase).fmvolume) {
    this_00 = (this->super_OPNBase).csmch;
    if ((this->super_OPNBase).super_Timer.regtc < 0x40) {
      Channel4::SetFNum(this_00,*(uint *)((long)this +
                                         ((long)this_00 + (-0x280 - (long)this) >> 5) *
                                         0x4de9bd37a6f4de9c + 500));
    }
    else {
      Operator::SetFNum(this_00->op,this->fnum3[1]);
      Operator::SetFNum(((this->super_OPNBase).csmch)->op + 1,this->fnum3[2]);
      Operator::SetFNum(((this->super_OPNBase).csmch)->op + 2,this->fnum3[0]);
      Operator::SetFNum(((this->super_OPNBase).csmch)->op + 3,this->fnum[2]);
    }
    iVar1 = Channel4::Prepare((Channel4 *)&this->field_0x840);
    iVar2 = Channel4::Prepare((Channel4 *)&this->field_0x560);
    uVar3 = Channel4::Prepare((Channel4 *)&this->field_0x280);
    uVar3 = uVar3 | iVar2 << 2 | iVar1 << 4;
    if ((this->reg29 & 0x80) != 0) {
      iVar1 = Channel4::Prepare((Channel4 *)&this->field_0xb20);
      iVar2 = Channel4::Prepare((Channel4 *)&this->field_0xe00);
      iVar4 = Channel4::Prepare((Channel4 *)&this->field_0x10e0);
      uVar3 = uVar3 | iVar1 << 6 | iVar2 << 8 | iVar4 << 10;
    }
    if ((uVar3 & 0x555) != 0) {
      if ((this->reg22 & 8) == 0) {
        uVar3 = uVar3 & 0x555;
      }
      Mix6(this,buffer,nsamples,uVar3);
      return;
    }
  }
  return;
}

Assistant:

void OPNABase::FMMix(Sample* buffer, int nsamples)
{
	if (fmvolume > 0)
	{
		// ����
		// Set F-Number
		if (!(regtc & 0xc0))
			csmch->SetFNum(fnum[csmch-ch]);
		else
		{
			// ���ʉ����[�h
			csmch->op[0].SetFNum(fnum3[1]);	csmch->op[1].SetFNum(fnum3[2]);
			csmch->op[2].SetFNum(fnum3[0]);	csmch->op[3].SetFNum(fnum[2]);
		}

		int act = (((ch[2].Prepare() << 2) | ch[1].Prepare()) << 2) | ch[0].Prepare();
		if (reg29 & 0x80)
			act |= (ch[3].Prepare() | ((ch[4].Prepare() | (ch[5].Prepare() << 2)) << 2)) << 6;
		if (!(reg22 & 0x08))
			act &= 0x555;

		if (act & 0x555)
		{
			Mix6(buffer, nsamples, act);
		}
	}
}